

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcEnv.h
# Opt level: O2

void __thiscall GrcEnv::GrcEnv(GrcEnv *this)

{
  this->m_psymTable = (Symbol)0x0;
  this->m_nPass = 0;
  this->m_mUnits = 1000;
  this->m_nPointRadius = 2;
  this->m_mPrUnits = 1000;
  this->m_nMaxRuleLoop = 5;
  this->m_nMaxBackup = 0;
  this->m_fAttrOverride = true;
  this->m_wCodePage = 0x4e4;
  return;
}

Assistant:

GrcEnv()
	{
		m_psymTable = NULL;
		m_nPass = 0;
		m_mUnits = 1000;
		m_nPointRadius = 2;
		m_mPrUnits = 1000;
		m_nMaxRuleLoop = 5;
		m_nMaxBackup = 0;
		m_fAttrOverride = true;
		m_wCodePage = 1252;
	}